

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
CustomUintFormatter<8,false>::Unser<DataStream,ServiceFlags>
          (CustomUintFormatter<8,false> *this,DataStream *s,ServiceFlags *v)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  raw = 0;
  DataStream::read(s,(int)&raw,(void *)0x8,in_RCX);
  *v = raw;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, I& v)
    {
        using U = typename std::conditional<std::is_enum<I>::value, std::underlying_type<I>, std::common_type<I>>::type::type;
        static_assert(std::numeric_limits<U>::max() >= MAX && std::numeric_limits<U>::min() <= 0, "Assigned type too small");
        uint64_t raw = 0;
        if (BigEndian) {
            s.read(AsWritableBytes(Span{&raw, 1}).last(Bytes));
            v = static_cast<I>(be64toh_internal(raw));
        } else {
            s.read(AsWritableBytes(Span{&raw, 1}).first(Bytes));
            v = static_cast<I>(le64toh_internal(raw));
        }
    }